

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

string * __thiscall test_upscale::vars_abi_cxx11_(string *__return_storage_ptr__,test_upscale *this)

{
  size_type *psVar1;
  bool bVar2;
  undefined8 uVar3;
  char *__s;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  string __str;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0 [2];
  long local_c0 [2];
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  __s = (char *)ggml_type_name(this->type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,__s,(allocator<char> *)&local_250);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x158f46);
  local_f0 = &local_e0;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_e0 = *plVar6;
    lStack_d8 = plVar4[3];
  }
  else {
    local_e0 = *plVar6;
    local_f0 = (long *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_1e0 = *puVar7;
    lStack_1d8 = plVar4[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar7;
    local_1f0 = (ulong *)*plVar4;
  }
  local_1e8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<long,4ul>(&local_70,&this->ne);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x158fbc);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_240 = *puVar7;
    lStack_238 = plVar4[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar7;
    local_250 = (ulong *)*plVar4;
  }
  local_248 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar8 = 0xf;
  if (local_1f0 != &local_1e0) {
    uVar8 = local_1e0;
  }
  if (uVar8 < (ulong)(local_248 + local_1e8)) {
    uVar8 = 0xf;
    if (local_250 != &local_240) {
      uVar8 = local_240;
    }
    if (uVar8 < (ulong)(local_248 + local_1e8)) goto LAB_0013fe52;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_1f0);
  }
  else {
LAB_0013fe52:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_250);
  }
  local_190 = &local_180;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_180 = *plVar4;
    uStack_178 = puVar5[3];
  }
  else {
    local_180 = *plVar4;
    local_190 = (long *)*puVar5;
  }
  local_188 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_1c0 = *puVar7;
    lStack_1b8 = plVar4[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *puVar7;
    local_1d0 = (ulong *)*plVar4;
  }
  local_1c8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<int>(&local_90,&this->scale_factor);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1592b6);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_200 = *puVar7;
    lStack_1f8 = plVar4[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar7;
    local_210 = (ulong *)*plVar4;
  }
  local_208 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar8 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar8 = local_1c0;
  }
  if (uVar8 < (ulong)(local_208 + local_1c8)) {
    uVar8 = 0xf;
    if (local_210 != &local_200) {
      uVar8 = local_200;
    }
    if (uVar8 < (ulong)(local_208 + local_1c8)) goto LAB_0013ffe4;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_1d0);
  }
  else {
LAB_0013ffe4:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_210);
  }
  local_170 = &local_160;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_160 = *plVar4;
    uStack_158 = puVar5[3];
  }
  else {
    local_160 = *plVar4;
    local_170 = (long *)*puVar5;
  }
  local_168 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_120 = *puVar7;
    lStack_118 = plVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar7;
    local_130 = (ulong *)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str_abi_cxx11_(&local_b0,this->mode);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x15925d);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_220 = *puVar7;
    lStack_218 = plVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar7;
    local_230 = (ulong *)*plVar4;
  }
  local_228 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar8 = 0xf;
  if (local_130 != &local_120) {
    uVar8 = local_120;
  }
  if (uVar8 < (ulong)(local_228 + local_128)) {
    uVar8 = 0xf;
    if (local_230 != &local_220) {
      uVar8 = local_220;
    }
    if (uVar8 < (ulong)(local_228 + local_128)) goto LAB_00140179;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00140179:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_230);
  }
  local_150 = &local_140;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_140 = *plVar4;
    uStack_138 = puVar5[3];
  }
  else {
    local_140 = *plVar4;
    local_150 = (long *)*puVar5;
  }
  local_148 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_100 = *puVar7;
    lStack_f8 = plVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar7;
    local_110 = (ulong *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  bVar2 = this->transpose;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct((ulong)local_d0,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d0[0],1,(uint)bVar2);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_d0,0,(char *)0x0,0x1592c4);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_1a0 = *puVar7;
    lStack_198 = plVar4[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar7;
    local_1b0 = (ulong *)*plVar4;
  }
  local_1a8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar8 = 0xf;
  if (local_110 != &local_100) {
    uVar8 = local_100;
  }
  if (uVar8 < (ulong)(local_1a8 + local_108)) {
    uVar8 = 0xf;
    if (local_1b0 != &local_1a0) {
      uVar8 = local_1a0;
    }
    if ((ulong)(local_1a8 + local_108) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_110);
      goto LAB_00140377;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_1b0);
LAB_00140377:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar3 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR5(type, ne, scale_factor, mode, transpose);
    }